

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Scanner::scan(Scanner *this,string *filename)

{
  char c;
  int iVar1;
  byte bVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  string local_1040;
  string local_1020;
  allocator<char> local_ff9;
  undefined8 local_ff8;
  undefined4 uStack_ff0;
  undefined4 uStack_fec;
  int_type local_fe8;
  undefined4 uStack_fe4;
  undefined4 uStack_fe0;
  undefined4 uStack_fdc;
  string local_fd0 [8];
  string text;
  istreambuf_iterator<char,_std::char_traits<char>_> end;
  istreambuf_iterator<char,_std::char_traits<char>_> begin;
  ifstream in;
  undefined1 local_d88 [8];
  Automatic at;
  allocator local_51;
  undefined1 local_50 [8];
  string buffer;
  int pos;
  int iStack_20;
  char curChar;
  int stateBefore;
  int state;
  bool comment;
  string *filename_local;
  Scanner *this_local;
  
  stateBefore._3_1_ = 0;
  iStack_20 = 1;
  buffer.field_2._12_4_ = 0;
  _state = filename;
  filename_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  Automatic::Automatic((Automatic *)local_d88);
  std::ifstream::ifstream(&begin._M_c,(string *)filename,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&begin._M_c + *(long *)(begin._8_8_ + -0x18)));
  if ((bVar2 & 1) != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"open Error");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)&end._M_c,
             (istream_type *)&begin._M_c);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)((long)&text.field_2 + 8));
  local_fe8 = end._M_c;
  uStack_fe4 = end._12_4_;
  uStack_fe0 = SUB84(begin._M_sbuf,0);
  uStack_fdc = (undefined4)((ulong)begin._M_sbuf >> 0x20);
  local_ff8 = text.field_2._8_8_;
  uStack_ff0 = SUB84(end._M_sbuf,0);
  uStack_fec = (undefined4)((ulong)end._M_sbuf >> 0x20);
  std::allocator<char>::allocator();
  __beg._M_c = uStack_fe0;
  __beg._M_sbuf = (streambuf_type *)_local_fe8;
  __end._M_c = uStack_ff0;
  __end._M_sbuf = (streambuf_type *)local_ff8;
  __beg._12_4_ = 0;
  __end._12_4_ = 0;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_fd0,__beg,__end,&local_ff9);
  std::allocator<char>::~allocator(&local_ff9);
  std::__cxx11::string::operator+=(local_fd0,"\n");
  std::ifstream::close();
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = this->curIndex;
        lVar3 = std::__cxx11::string::size();
        if (iVar1 == lVar3) {
          std::__cxx11::string::~string(local_fd0);
          std::ifstream::~ifstream(&begin._M_c);
          Automatic::~Automatic((Automatic *)local_d88);
          std::__cxx11::string::~string((string *)local_50);
          return;
        }
        this->curIndex = this->curIndex + 1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_fd0);
        iVar1 = iStack_20;
        c = *pcVar4;
        if (((stateBefore._3_1_ & 1) == 0) || (c == '*')) break;
        if (c == '\n') {
          this->curLine = this->curLine + 1;
        }
      }
      if ((c == '*') && ((stateBefore._3_1_ & 1) != 0)) break;
      if ((((c == '\n') || (c == '\t')) || (c == ' ')) || (c == '\r')) {
        if (c == '\n') {
          this->curLine = this->curLine + 1;
        }
        std::__cxx11::string::string((string *)&local_1020,(string *)local_50);
        tokenGenerate(this,iVar1,&local_1020);
        std::__cxx11::string::~string((string *)&local_1020);
        std::__cxx11::string::operator=((string *)local_50,"");
        iStack_20 = 1;
      }
      else {
        iStack_20 = Automatic::getState((Automatic *)local_d88,iStack_20,c);
        if ((iStack_20 != 1) || (iVar1 != 1)) {
          if (iStack_20 == 0) {
            if (iVar1 == 0x2b) {
              stateBefore._3_1_ = 1;
              reset(this,&stack0xffffffffffffffe0,(int *)(buffer.field_2._M_local_buf + 0xc),
                    (string *)local_50);
            }
            else {
              std::__cxx11::string::string((string *)&local_1040,(string *)local_50);
              tokenGenerate(this,iVar1,&local_1040);
              std::__cxx11::string::~string((string *)&local_1040);
              reset(this,&stack0xffffffffffffffe0,(int *)(buffer.field_2._M_local_buf + 0xc),
                    (string *)local_50);
            }
          }
          else {
            std::__cxx11::string::operator+=((string *)local_50,c);
          }
        }
      }
    }
    this->curIndex = this->curIndex + 1;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_fd0);
    if (*pcVar4 != '/') break;
    stateBefore._3_1_ = 0;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"comment is error");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

void Scanner::scan(string filename) {
    bool comment = false; //是否有注释
    int state = 1;   //当前状态
    int stateBefore = 1; //前一个状态
    char curChar; //当前字符
    int pos = 0;  //当前位置
    string buffer = ""; //识别到的串
    Automatic at; //初始化自动机
    //int comment_cnt = 0;
    //暂时取消
    ifstream in(filename, ios::in);
    if (!in) {
        cout << "open Error" << endl;
        exit(0);
    }

    //读取文件内容
    istreambuf_iterator<char> begin(in), end;
    string text(begin, end);
    text += "\n";
    in.close();

    //cout << text << endl;

    while (curIndex != text.size()) {
        curChar = text[curIndex++];
        if (comment && curChar != '*') {
            if(curChar == '\n') curLine++;
            continue;
        } else if (curChar == '*' && comment) {
            curChar = text[curIndex++];
            if (curChar == '/') {
                comment = false;
                continue;
            } else {
                cout << "comment is error" << endl;
                exit(0);
            }
        }
        //跳过空格 换行符 \t 以及回车
        if (curChar == '\n' || curChar == '\t' || curChar == ' ' || curChar == '\r') {
            if (curChar == '\n') curLine++;
            tokenGenerate(state, buffer);
            buffer = "";
            state = 1;
            continue;
        }

        stateBefore = state;
        state = at.getState(state, curChar);
        //自动机扫描
        if (state == 1 && stateBefore == 1) {}
        else if (state) {
            buffer += curChar;
        } else {
            //判断是否为注释
            if (stateBefore == 43) {
                comment = true;
                //cout << buffer << endl;
                reset(state, pos, buffer);
                continue;
            }


            tokenGenerate(stateBefore, buffer);
            reset(state, pos, buffer);
        }
    }
}